

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmMakefile *mf)

{
  char *pcVar1;
  ostream *poVar2;
  string args;
  string filename;
  string make;
  cmGeneratedFileStream fout;
  allocator local_2e2;
  allocator local_2e1;
  string local_2e0;
  string local_2c0;
  char *local_2a0 [4];
  string local_280 [32];
  undefined1 local_260 [584];
  
  pcVar1 = cmMakefile::GetHomeOutputDirectory(mf);
  std::__cxx11::string::string((string *)local_2a0,pcVar1,(allocator *)local_260);
  std::__cxx11::string::append((char *)local_2a0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_260,local_2a0[0],false);
  if (((byte)(*(_func_int **)(local_260._0_8_ + -0x18))[(long)(local_260 + 0x20)] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_2c0,"CMAKE_MAKE_PROGRAM",(allocator *)&local_2e0);
    pcVar1 = cmMakefile::GetRequiredDefinition(mf,&local_2c0);
    std::__cxx11::string::string(local_280,pcVar1,&local_2e2);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string((string *)&local_2e0,"CMAKE_KATE_MAKE_ARGUMENTS",&local_2e2);
    pcVar1 = cmMakefile::GetSafeDefinition(mf,&local_2e0);
    std::__cxx11::string::string((string *)&local_2c0,pcVar1,&local_2e1);
    std::__cxx11::string::~string((string *)&local_2e0);
    poVar2 = std::operator<<((ostream *)local_260,"{\n\t\"name\": \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->ProjectName);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"directory\": \"");
    pcVar1 = cmMakefile::GetHomeDirectory(mf);
    poVar2 = std::operator<<(poVar2,pcVar1);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2e0,this,mf);
    poVar2 = std::operator<<(poVar2,(string *)&local_2e0);
    std::operator<<(poVar2,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2e0);
    WriteTargets(this,mf,(cmGeneratedFileStream *)local_260);
    std::operator<<((ostream *)local_260,"}\n");
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string(local_280);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  std::__cxx11::string::~string((string *)local_2a0);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(const cmMakefile* mf) const
{
  std::string filename = mf->GetHomeOutputDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string args = mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");

  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << mf->GetHomeDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(mf) << "} ],\n";
  this->WriteTargets(mf, fout);
  fout << "}\n";
}